

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void xmlHashFree(xmlHashTablePtr hash,xmlHashDeallocator dealloc)

{
  xmlHashEntry *pxVar1;
  xmlHashEntry *pxVar2;
  
  if (hash != (xmlHashTablePtr)0x0) {
    pxVar2 = hash->table;
    if (pxVar2 != (xmlHashEntry *)0x0) {
      if ((ulong)hash->size != 0) {
        pxVar1 = pxVar2 + hash->size;
        do {
          if (pxVar2->hashValue != 0) {
            if ((dealloc != (xmlHashDeallocator)0x0) && (pxVar2->payload != (void *)0x0)) {
              (*dealloc)(pxVar2->payload,pxVar2->key);
            }
            if (hash->dict == (xmlDictPtr)0x0) {
              if (pxVar2->key != (xmlChar *)0x0) {
                (*xmlFree)(pxVar2->key);
              }
              if (pxVar2->key2 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar2->key2);
              }
              if (pxVar2->key3 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar2->key3);
              }
            }
          }
          pxVar2 = pxVar2 + 1;
        } while (pxVar2 < pxVar1);
        pxVar2 = hash->table;
      }
      (*xmlFree)(pxVar2);
    }
    if (hash->dict != (xmlDictPtr)0x0) {
      xmlDictFree(hash->dict);
    }
    (*xmlFree)(hash);
    return;
  }
  return;
}

Assistant:

void
xmlHashFree(xmlHashTablePtr hash, xmlHashDeallocator dealloc) {
    if (hash == NULL)
        return;

    if (hash->table) {
        const xmlHashEntry *end = &hash->table[hash->size];
        const xmlHashEntry *entry;

        for (entry = hash->table; entry < end; entry++) {
            if (entry->hashValue == 0)
                continue;
            if ((dealloc != NULL) && (entry->payload != NULL))
                dealloc(entry->payload, entry->key);
            if (hash->dict == NULL) {
                if (entry->key)
                    xmlFree(entry->key);
                if (entry->key2)
                    xmlFree(entry->key2);
                if (entry->key3)
                    xmlFree(entry->key3);
            }
        }

        xmlFree(hash->table);
    }

    if (hash->dict)
        xmlDictFree(hash->dict);

    xmlFree(hash);
}